

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::RegexpExtractAllFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  FunctionNullHandling in_stack_fffffffffffffa68;
  bind_lambda_function_t in_stack_fffffffffffffa70;
  LogicalType local_588;
  ScalarFunctionSet *local_570;
  scalar_function_t local_568;
  scalar_function_t local_548;
  scalar_function_t local_528;
  LogicalType local_500 [4];
  LogicalType local_4a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_488;
  LogicalType local_470;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_458;
  LogicalType local_440;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_428;
  LogicalType local_410;
  LogicalType local_3f8;
  LogicalType local_3e0;
  string local_3c8;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"regexp_extract_all","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  local_570 = in_RDI;
  LogicalType::LogicalType(local_500,VARCHAR);
  LogicalType::LogicalType(local_500 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_500;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_428,__l,(allocator_type *)&stack0xfffffffffffffa77);
  LogicalType::LogicalType(&local_588,VARCHAR);
  LogicalType::LIST(&local_440,&local_588);
  local_528.super__Function_base._M_functor._8_8_ = 0;
  local_528.super__Function_base._M_functor._M_unused._M_object = RegexpExtractAll::Execute;
  local_528._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_528.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3e0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  varargs._0_8_ = &local_3e0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_428,&local_440,&local_528,
             RegexpExtractAll::Bind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             RegexpExtractAll::InitLocalState,varargs,CONSISTENT,in_stack_fffffffffffffa68,
             in_stack_fffffffffffffa70);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_3e0);
  if (local_528.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_528.super__Function_base._M_manager)
              ((_Any_data *)&local_528,(_Any_data *)&local_528,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_440);
  LogicalType::~LogicalType(&local_588);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_428);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_500[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_500,VARCHAR);
  LogicalType::LogicalType(local_500 + 1,VARCHAR);
  LogicalType::LogicalType(local_500 + 2,INTEGER);
  __l_00._M_len = 3;
  __l_00._M_array = local_500;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_458,__l_00,(allocator_type *)&stack0xfffffffffffffa77);
  LogicalType::LogicalType(&local_588,VARCHAR);
  LogicalType::LIST(&local_470,&local_588);
  local_548.super__Function_base._M_functor._8_8_ = 0;
  local_548.super__Function_base._M_functor._M_unused._M_object = RegexpExtractAll::Execute;
  local_548._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_548.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3f8,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  varargs_00._0_8_ = &local_3f8;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_458,&local_470,&local_548,
             RegexpExtractAll::Bind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             RegexpExtractAll::InitLocalState,varargs_00,CONSISTENT,in_stack_fffffffffffffa68,
             in_stack_fffffffffffffa70);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_3f8);
  if (local_548.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_548.super__Function_base._M_manager)
              ((_Any_data *)&local_548,(_Any_data *)&local_548,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_470);
  LogicalType::~LogicalType(&local_588);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_458);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_500[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_500,VARCHAR);
  LogicalType::LogicalType(local_500 + 1,VARCHAR);
  LogicalType::LogicalType(local_500 + 2,INTEGER);
  LogicalType::LogicalType(local_500 + 3,VARCHAR);
  __l_01._M_len = 4;
  __l_01._M_array = local_500;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_488,__l_01,(allocator_type *)&stack0xfffffffffffffa77);
  LogicalType::LogicalType(&local_588,VARCHAR);
  LogicalType::LIST(&local_4a0,&local_588);
  local_568.super__Function_base._M_functor._8_8_ = 0;
  local_568.super__Function_base._M_functor._M_unused._M_object = RegexpExtractAll::Execute;
  local_568._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_568.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_410,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  varargs_01._0_8_ = &local_410;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_3a8,(vector<duckdb::LogicalType,_true> *)&local_488,&local_4a0,&local_568,
             RegexpExtractAll::Bind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             RegexpExtractAll::InitLocalState,varargs_01,CONSISTENT,in_stack_fffffffffffffa68,
             in_stack_fffffffffffffa70);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8.function,(_Any_data *)&local_3a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_410);
  if (local_568.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_568.super__Function_base._M_manager)
              ((_Any_data *)&local_568,(_Any_data *)&local_568,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_4a0);
  LogicalType::~LogicalType(&local_588);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_488);
  lVar1 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_500[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return local_570;
}

Assistant:

ScalarFunctionSet RegexpExtractAllFun::GetFunctions() {
	ScalarFunctionSet regexp_extract_all("regexp_extract_all");
	regexp_extract_all.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::LIST(LogicalType::VARCHAR),
	    RegexpExtractAll::Execute, RegexpExtractAll::Bind, nullptr, nullptr, RegexpExtractAll::InitLocalState,
	    LogicalType::INVALID, FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	regexp_extract_all.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::INTEGER}, LogicalType::LIST(LogicalType::VARCHAR),
	    RegexpExtractAll::Execute, RegexpExtractAll::Bind, nullptr, nullptr, RegexpExtractAll::InitLocalState,
	    LogicalType::INVALID, FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	regexp_extract_all.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::INTEGER, LogicalType::VARCHAR},
	                   LogicalType::LIST(LogicalType::VARCHAR), RegexpExtractAll::Execute, RegexpExtractAll::Bind,
	                   nullptr, nullptr, RegexpExtractAll::InitLocalState, LogicalType::INVALID,
	                   FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	return (regexp_extract_all);
}